

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QMYSQLResultPrivate::QMyField>::reallocateAndGrow
          (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMYSQLResultPrivate::QMyField> *old)

{
  QArrayData *pQVar1;
  QMyField *pQVar2;
  bool bVar3;
  char *pcVar4;
  MYSQL_FIELD *pMVar5;
  my_bool mVar6;
  undefined7 uVar7;
  QMyField *pQVar8;
  qsizetype qVar9;
  long lVar10;
  QMyField *pQVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<QMYSQLResultPrivate::QMyField> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar9 = 0;
        lVar10 = 0;
      }
      else {
        qVar9 = pQVar1->alloc;
        lVar10 = (this->size - pQVar1->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                 -0x3333333333333333;
      }
      auVar12 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x28,qVar9 + n + lVar10,Grow);
      this->d = (Data *)auVar12._0_8_;
      this->ptr = (QMyField *)auVar12._8_8_;
      goto LAB_00110389;
    }
  }
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (QMyField *)0xaaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar10 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar8 = this->ptr;
    pQVar2 = pQVar8 + lVar10;
    if ((old != (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x0) || (bVar3)) {
      if ((lVar10 != 0) && (0 < lVar10)) {
        pQVar11 = local_38.ptr + local_38.size;
        do {
          pQVar11->bufLength = pQVar8->bufLength;
          pcVar4 = pQVar8->outField;
          pMVar5 = pQVar8->myField;
          mVar6 = pQVar8->nullIndicator;
          uVar7 = *(undefined7 *)&pQVar8->field_0x19;
          (pQVar11->type).d_ptr = (pQVar8->type).d_ptr;
          pQVar11->nullIndicator = mVar6;
          *(undefined7 *)&pQVar11->field_0x19 = uVar7;
          pQVar11->outField = pcVar4;
          pQVar11->myField = pMVar5;
          pQVar8 = pQVar8 + 1;
          local_38.size = local_38.size + 1;
          pQVar11 = pQVar11 + 1;
        } while (pQVar8 < pQVar2);
      }
    }
    else if ((lVar10 != 0) && (0 < lVar10)) {
      pQVar11 = local_38.ptr + local_38.size;
      do {
        pQVar11->bufLength = pQVar8->bufLength;
        pcVar4 = pQVar8->outField;
        pMVar5 = pQVar8->myField;
        mVar6 = pQVar8->nullIndicator;
        uVar7 = *(undefined7 *)&pQVar8->field_0x19;
        (pQVar11->type).d_ptr = (pQVar8->type).d_ptr;
        pQVar11->nullIndicator = mVar6;
        *(undefined7 *)&pQVar11->field_0x19 = uVar7;
        pQVar11->outField = pcVar4;
        pQVar11->myField = pMVar5;
        pQVar8 = pQVar8 + 1;
        local_38.size = local_38.size + 1;
        pQVar11 = pQVar11 + 1;
      } while (pQVar8 < pQVar2);
    }
  }
  pQVar1 = &this->d->super_QArrayData;
  pQVar2 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar9 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar1;
  local_38.ptr = pQVar2;
  local_38.size = qVar9;
  if (old != (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pQVar2;
    local_38.size = old->size;
    old->size = qVar9;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x28,0x10);
    }
  }
LAB_00110389:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }